

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

void __thiscall jaegertracing::thrift::Tag::printTo(Tag *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  double *t_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_02;
  string local_128;
  byte local_101;
  string local_100;
  byte local_d9;
  string local_d8;
  byte local_b1;
  string local_b0;
  byte local_89;
  string local_88;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  Tag *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"Tag(");
  poVar1 = std::operator<<(local_18,"key=");
  apache::thrift::to_string<std::__cxx11::string>(&local_38,(thrift *)&this->key,t);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"vType=");
  apache::thrift::to_string<jaegertracing::thrift::TagType::type>(&local_68,&this->vType);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"vStr=");
  poVar1 = local_18;
  local_89 = 0;
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(&local_88,(thrift *)&this->vStr,t_00);
    local_89 = 1;
    std::operator<<(poVar1,(string *)&local_88);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"vDouble=");
  poVar1 = local_18;
  local_b1 = 0;
  if (((byte)this->__isset >> 1 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string_abi_cxx11_(&local_b0,(thrift *)&this->vDouble,t_01);
    local_b1 = 1;
    std::operator<<(poVar1,(string *)&local_b0);
  }
  if ((local_b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"vBool=");
  poVar1 = local_18;
  local_d9 = 0;
  if (((byte)this->__isset >> 2 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<bool>(&local_d8,&this->vBool);
    local_d9 = 1;
    std::operator<<(poVar1,(string *)&local_d8);
  }
  if ((local_d9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"vLong=");
  poVar1 = local_18;
  local_101 = 0;
  if (((byte)this->__isset >> 3 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_100,&this->vLong);
    local_101 = 1;
    std::operator<<(poVar1,(string *)&local_100);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"vBinary=");
  poVar1 = local_18;
  if (((byte)this->__isset >> 4 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(&local_128,(thrift *)&this->vBinary,t_02);
    std::operator<<(poVar1,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::operator<<(local_18,")");
  return;
}

Assistant:

void Tag::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Tag(";
  out << "key=" << to_string(key);
  out << ", " << "vType=" << to_string(vType);
  out << ", " << "vStr="; (__isset.vStr ? (out << to_string(vStr)) : (out << "<null>"));
  out << ", " << "vDouble="; (__isset.vDouble ? (out << to_string(vDouble)) : (out << "<null>"));
  out << ", " << "vBool="; (__isset.vBool ? (out << to_string(vBool)) : (out << "<null>"));
  out << ", " << "vLong="; (__isset.vLong ? (out << to_string(vLong)) : (out << "<null>"));
  out << ", " << "vBinary="; (__isset.vBinary ? (out << to_string(vBinary)) : (out << "<null>"));
  out << ")";
}